

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool laplace_check(double param_1,double b)

{
  double b_local;
  double param_0_local;
  
  if (0.0 >= b) {
    std::operator<<((ostream *)&std::cout," \n");
    std::operator<<((ostream *)&std::cout,"LAPLACE_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cout,"  B <= 0.\n");
  }
  return 0.0 < b;
}

Assistant:

bool laplace_check ( double /*a*/, double b )

//****************************************************************************80
//
//  Purpose:
//
//    LAPLACE_CHECK checks the parameters of the Laplace PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < B.
//
//    Output, bool LAPLACE_CHECK, is true if the parameters are legal.
//
{
  if ( b <= 0.0 )
  {
    cout << " \n";
    cout << "LAPLACE_CHECK - Warning!\n";
    cout << "  B <= 0.\n";
    return false;
  }
  return true;
}